

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void testTinySVD_3x3<double>(Matrix33<double> *A)

{
  bool bVar1;
  ostream *poVar2;
  double (*padVar3) [3];
  int i;
  long lVar4;
  int j;
  long lVar5;
  int cols [3];
  Matrix33<double> B;
  int local_80 [4];
  double local_70;
  double local_68;
  double dStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  
  std::operator<<((ostream *)&std::cout,"Verifying SVD for [[");
  poVar2 = std::ostream::_M_insert<double>(A->x[0][0]);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>(A->x[0][1]);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>(A->x[0][2]);
  poVar2 = std::operator<<(poVar2,"], ");
  std::operator<<(poVar2,"[");
  poVar2 = std::ostream::_M_insert<double>(A->x[1][0]);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>(A->x[1][1]);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>(A->x[1][2]);
  poVar2 = std::operator<<(poVar2,"], ");
  std::operator<<(poVar2,"[");
  poVar2 = std::ostream::_M_insert<double>(A->x[2][0]);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>(A->x[2][1]);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>(A->x[2][2]);
  std::operator<<(poVar2,"]]\n");
  verifyTinySVD_3x3<double>(A);
  Imath_3_2::Matrix33<double>::transposed(A);
  verifyTinySVD_3x3<double>((Matrix33<double> *)&local_70);
  local_80[0] = 0;
  local_80[1] = 1;
  local_80[2] = 2;
  do {
    local_70 = 1.0;
    local_68 = 0.0;
    dStack_60 = 0.0;
    local_58 = 0;
    local_50 = 0x3ff0000000000000;
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_30 = 0x3ff0000000000000;
    padVar3 = (double (*) [3])&local_70;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        (*(double (*) [3])*padVar3)[lVar5] = A->x[lVar4][local_80[lVar5]];
      }
      padVar3 = padVar3 + 1;
    }
    verifyTinySVD_3x3<double>((Matrix33<double> *)&local_70);
    bVar1 = std::__next_permutation<int*,__gnu_cxx::__ops::_Iter_less_iter>(local_80);
  } while (bVar1);
  return;
}

Assistant:

void
testTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", "
              << A[0][2] << "], "
              << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << "], "
              << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << "]]\n";

    verifyTinySVD_3x3 (A);
    verifyTinySVD_3x3 (A.transposed ());

    // Try all different orderings of the columns of A:
    int cols[3] = {0, 1, 2};
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix33<T> B;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_3x3 (B);
    } while (std::next_permutation (cols, cols + 3));
}